

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

string * __thiscall
pbrt::
TaggedPointer<pbrt::SimplePrimitive,pbrt::GeometricPrimitive,pbrt::TransformedPrimitive,pbrt::AnimatedPrimitive,pbrt::BVHAggregate,pbrt::KdTreeAggregate>
::ToString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  unsigned_short *in_R8;
  undefined2 local_12;
  ulong local_10;
  
  local_10 = *this & 0xffffffffffff;
  local_12 = (undefined2)(*this >> 0x30);
  StringPrintf<void_const*,unsigned_short>
            (__return_storage_ptr__,(pbrt *)"[ TaggedPointer ptr: 0x%p tag: %d ]",(char *)&local_10,
             (void **)&local_12,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TaggedPointer ptr: 0x%p tag: %d ]", ptr(), Tag());
    }